

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O1

void __thiscall EventLoop::assertInLoopThread(EventLoop *this)

{
  int iVar1;
  int *in_FS_OFFSET;
  
  iVar1 = this->threadId_;
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  if (iVar1 == *in_FS_OFFSET) {
    return;
  }
  __assert_fail("isInLoopThread()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.h"
                ,0x1a,"void EventLoop::assertInLoopThread()");
}

Assistant:

void assertInLoopThread() { assert(isInLoopThread()); }